

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.hpp
# Opt level: O3

void __thiscall pg::QPTSolver::todo_push(QPTSolver *this,int node)

{
  int iVar1;
  uint64_t *puVar2;
  ulong uVar3;
  ostream *poVar4;
  
  puVar2 = (this->dirty)._bits;
  uVar3 = puVar2[(ulong)(long)node >> 6];
  if ((uVar3 >> ((ulong)(uint)node & 0x3f) & 1) == 0) {
    iVar1 = (this->todo).pointer;
    (this->todo).pointer = iVar1 + 1;
    (this->todo).queue[iVar1] = node;
    puVar2[(ulong)(long)node >> 6] = uVar3 | 1L << ((ulong)(uint)node & 0x3f);
    if (2 < (this->super_Solver).trace) {
      poVar4 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"push(",5);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,node);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      return;
    }
  }
  return;
}

Assistant:

void todo_push(int node) {
        if (dirty[node]) return;
        todo.push(node);
        dirty[node] = 1;
#ifndef NDEBUG
        if (trace >= 3) logger << "push(" << node << ")" << std::endl;
#endif
    }